

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtDecide.c
# Opt level: O0

void Cgt_ManCollectFanoutPos_rec(Aig_Man_t *pAig,Aig_Obj_t *pObj,Vec_Ptr_t *vFanout)

{
  bool bVar1;
  int iVar2;
  int local_38;
  int local_30;
  int local_2c;
  int iFanout;
  int f;
  Aig_Obj_t *pFanout;
  Vec_Ptr_t *vFanout_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *pAig_local;
  
  local_30 = -1;
  iVar2 = Aig_ObjIsTravIdCurrent(pAig,pObj);
  if (iVar2 == 0) {
    Aig_ObjSetTravIdCurrent(pAig,pObj);
    iVar2 = Aig_ObjIsCo(pObj);
    if (iVar2 == 0) {
      if (pAig->pFanData == (int *)0x0) {
        __assert_fail("pAig->pFanData",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cgt/cgtDecide.c"
                      ,0x40,
                      "void Cgt_ManCollectFanoutPos_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
      }
      local_2c = 0;
      while( true ) {
        bVar1 = false;
        if (local_2c < (int)((uint)(*(ulong *)&pObj->field_0x18 >> 6) & 0x3ffffff)) {
          if (local_2c == 0) {
            local_38 = Aig_ObjFanout0Int(pAig,pObj->Id);
          }
          else {
            local_38 = Aig_ObjFanoutNext(pAig,local_30);
          }
          local_30 = local_38;
          _iFanout = Aig_ManObj(pAig,local_38 >> 1);
          bVar1 = true;
        }
        if (!bVar1) break;
        Cgt_ManCollectFanoutPos_rec(pAig,_iFanout,vFanout);
        local_2c = local_2c + 1;
      }
    }
    else {
      Vec_PtrPush(vFanout,pObj);
    }
  }
  return;
}

Assistant:

void Cgt_ManCollectFanoutPos_rec( Aig_Man_t * pAig, Aig_Obj_t * pObj, Vec_Ptr_t * vFanout )
{
    Aig_Obj_t * pFanout;
    int f, iFanout = -1;
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    if ( Aig_ObjIsCo(pObj) )
    {
        Vec_PtrPush( vFanout, pObj );
        return;
    }
    Aig_ObjForEachFanout( pAig, pObj, pFanout, iFanout, f )
        Cgt_ManCollectFanoutPos_rec( pAig, pFanout, vFanout );
}